

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

RegexPattern *
Js::RegexHelper::CompileDynamic
          (ScriptContext *scriptContext,char16 *psz,CharCount csz,char16 *pszOpts,CharCount cszOpts,
          bool isLiteralSource)

{
  code *pcVar1;
  ScriptContext *this;
  bool bVar2;
  undefined4 *puVar3;
  RegexPattern *pRVar4;
  RegexPatternMruMap *this_00;
  undefined7 in_register_00000089;
  undefined1 local_88 [8];
  RegexKey lookupKey;
  InternalString source;
  RegexKey finalKey;
  RegexPattern *local_50;
  RegexPattern *pattern;
  ScriptContext *local_40;
  uint local_38;
  RegexFlags local_31 [8];
  RegexFlags flags;
  
  local_38 = (uint)CONCAT71(in_register_00000089,isLiteralSource);
  local_40 = scriptContext;
  if ((psz == (char16 *)0x0) || (psz[csz] != L'\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x51,"(psz != 0 && psz[csz] == 0)","psz != 0 && psz[csz] == 0");
    if (!bVar2) goto LAB_00d4adc6;
    *puVar3 = 0;
  }
  if (cszOpts != 0 && pszOpts == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x52,"(pszOpts != 0 || cszOpts == 0)",
                                "pszOpts != 0 || cszOpts == 0");
    if (!bVar2) goto LAB_00d4adc6;
    *puVar3 = 0;
  }
  if ((pszOpts != (char16 *)0x0) && (pszOpts[cszOpts] != L'\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x53,"(pszOpts == 0 || pszOpts[cszOpts] == 0)",
                                "pszOpts == 0 || pszOpts[cszOpts] == 0");
    if (!bVar2) goto LAB_00d4adc6;
    *puVar3 = 0;
  }
  local_31[0] = NoRegexFlags;
  if (pszOpts != (char16 *)0x0) {
    bVar2 = GetFlags(local_40,pszOpts,cszOpts,local_31);
    if (!bVar2) {
      PrimCompileDynamic(local_40,psz,csz,pszOpts,cszOpts,(bool)(char)local_38);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x5d,"(false)","false");
      if (!bVar2) {
LAB_00d4adc6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  this = local_40;
  if ((char)local_38 != '\0') {
    pRVar4 = PrimCompileDynamic(local_40,psz,csz,pszOpts,cszOpts,true);
    return pRVar4;
  }
  local_40 = (ScriptContext *)CONCAT44(local_40._4_4_,cszOpts);
  local_38 = (uint)local_31[0];
  UnifiedRegex::RegexKey::RegexKey((RegexKey *)local_88,psz,csz,local_31[0]);
  local_50 = (RegexPattern *)0x0;
  pattern._4_4_ = csz;
  this_00 = ScriptContext::GetDynamicRegexMap(this);
  bVar2 = JsUtil::
          MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
          ::TryGetValue(this_00,(RegexKey *)local_88,&local_50);
  if (!bVar2) {
    local_50 = PrimCompileDynamic(this,psz,pattern._4_4_,pszOpts,(CharCount)local_40,false);
    UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&lookupKey.length);
    UnifiedRegex::RegexKey::RegexKey
              ((RegexKey *)&source.m_content,
               (char16 *)((ulong)((uint)lookupKey.flags * 2) + source._0_8_),lookupKey.length,
               (RegexFlags)local_38);
    JsUtil::
    MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
    ::Add(this_00,(RegexKey *)&source.m_content,&local_50);
  }
  return local_50;
}

Assistant:

UnifiedRegex::RegexPattern* RegexHelper::CompileDynamic(ScriptContext *scriptContext, const char16* psz, CharCount csz, const char16* pszOpts, CharCount cszOpts, bool isLiteralSource)
    {
        Assert(psz != 0 && psz[csz] == 0);
        Assert(pszOpts != 0 || cszOpts == 0);
        Assert(pszOpts == 0 || pszOpts[cszOpts] == 0);

        UnifiedRegex::RegexFlags flags = UnifiedRegex::NoRegexFlags;

        if (pszOpts != NULL)
        {
            if (!GetFlags(scriptContext, pszOpts, cszOpts, flags))
            {
                // Compile in order to throw appropriate error for ill-formed flags
                PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
                Assert(false);
            }
        }

        if(isLiteralSource)
        {
            // The source is from a literal regex, so we're cloning a literal regex. Don't use the dynamic regex MRU map since
            // these literal regex patterns' lifetimes are tied with the function body.
            return PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);
        }

        UnifiedRegex::RegexKey lookupKey(psz, csz, flags);
        UnifiedRegex::RegexPattern* pattern = nullptr;
        RegexPatternMruMap* dynamicRegexMap = scriptContext->GetDynamicRegexMap();
        if (!dynamicRegexMap->TryGetValue(lookupKey, &pattern))
        {
            pattern = PrimCompileDynamic(scriptContext, psz, csz, pszOpts, cszOpts, isLiteralSource);

            // WARNING: Must calculate key again so that dictionary has copy of source associated with the pattern
            const auto source = pattern->GetSource();
            UnifiedRegex::RegexKey finalKey(source.GetBuffer(), source.GetLength(), flags);
            dynamicRegexMap->Add(finalKey, pattern);
        }
        return pattern;
    }